

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.hpp
# Opt level: O3

void __thiscall Omega_h::Adj::Adj(Adj *this,LOs *a2ab_,LOs *ab2b_,Read<signed_char> *codes_)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs local_38;
  LOs local_28;
  
  local_38.write_.shared_alloc_.alloc = (a2ab_->write_).shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_38.write_.shared_alloc_.direct_ptr = (a2ab_->write_).shared_alloc_.direct_ptr;
  local_28.write_.shared_alloc_.alloc = (ab2b_->write_).shared_alloc_.alloc;
  if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
      local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28.write_.shared_alloc_.alloc =
           (Alloc *)((local_28.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_28.write_.shared_alloc_.alloc)->use_count =
           (local_28.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_28.write_.shared_alloc_.direct_ptr = (ab2b_->write_).shared_alloc_.direct_ptr;
  Graph::Graph(&this->super_Graph,&local_38,&local_28);
  pAVar2 = local_28.write_.shared_alloc_.alloc;
  if (((ulong)local_28.write_.shared_alloc_.alloc & 7) == 0 &&
      local_28.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_28.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_28.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = local_38.write_.shared_alloc_.alloc;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  pAVar2 = (codes_->write_).shared_alloc_.alloc;
  (this->codes).write_.shared_alloc_.alloc = pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->codes).write_.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  (this->codes).write_.shared_alloc_.direct_ptr = (codes_->write_).shared_alloc_.direct_ptr;
  return;
}

Assistant:

Adj(LOs a2ab_, LOs ab2b_, Read<I8> codes_)
      : Graph(a2ab_, ab2b_), codes(codes_) {}